

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBlobAppend(SyBlob *pBlob,void *pData,sxu32 nSize)

{
  sxu32 local_4c;
  uchar *puStack_48;
  sxu32 xLen;
  uchar *xDst;
  uchar *xSrc;
  sxi32 rc;
  sxu8 *zBlob;
  uchar *puStack_20;
  sxu32 nSize_local;
  void *pData_local;
  SyBlob *pBlob_local;
  
  if (nSize == 0) {
    pBlob_local._4_4_ = 0;
  }
  else {
    zBlob._4_4_ = nSize;
    puStack_20 = (uchar *)pData;
    pData_local = pBlob;
    pBlob_local._4_4_ = BlobPrepareGrow(pBlob,(sxu32 *)((long)&zBlob + 4));
    if (pBlob_local._4_4_ == 0) {
      if (puStack_20 != (uchar *)0x0) {
        puStack_48 = (uchar *)(*(long *)((long)pData_local + 8) +
                              (ulong)*(uint *)((long)pData_local + 0x10));
        *(sxu32 *)((long)pData_local + 0x10) = zBlob._4_4_ + *(int *)((long)pData_local + 0x10);
        xDst = puStack_20;
        for (local_4c = zBlob._4_4_; local_4c != 0; local_4c = local_4c - 4) {
          *puStack_48 = *xDst;
          if (local_4c == 1) break;
          puStack_48[1] = xDst[1];
          if (local_4c == 2) break;
          puStack_48[2] = xDst[2];
          if (local_4c == 3) break;
          puStack_48[3] = xDst[3];
          puStack_48 = puStack_48 + 4;
          xDst = xDst + 4;
        }
      }
      pBlob_local._4_4_ = 0;
    }
  }
  return pBlob_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobAppend(SyBlob *pBlob, const void *pData, sxu32 nSize)
{
	sxu8 *zBlob;
	sxi32 rc;
	if( nSize < 1 ){
		return SXRET_OK;
	}
	rc = BlobPrepareGrow(&(*pBlob), &nSize);
	if( SXRET_OK != rc ){
		return rc;
	}
	if( pData ){
		zBlob = (sxu8 *)pBlob->pBlob ;
		zBlob = &zBlob[pBlob->nByte];
		pBlob->nByte += nSize;
		SX_MACRO_FAST_MEMCPY(pData, zBlob, nSize);
	}
	return SXRET_OK;
}